

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioCtl.cc
# Opt level: O0

bool __thiscall AudioCtl::key(AudioCtl *this,AKey key,bool pressed)

{
  int iVar1;
  ulong uVar2;
  __int_type _Var3;
  bool pressed_local;
  AKey key_local;
  AudioCtl *this_local;
  
  if (pressed) {
    if (key == AK_Space) {
      this->paused_ = (this->paused_ & 1U) != 1;
    }
    else if (key == AK_Left) {
      timeShift(this,-this->settings_->pattern_length);
    }
    else if (key == AK_Up) {
      timeShift(this,this->settings_->pattern_length << 2);
    }
    else if (key == AK_Right) {
      timeShift(this,this->settings_->pattern_length);
    }
    else if (key == AK_Down) {
      timeShift(this,this->settings_->pattern_length * -4);
    }
    else if (key == AK_M) {
      this->muted_ = (bool)((this->muted_ ^ 0xffU) & 1);
    }
    else {
      if (key != AK_Z) {
        return false;
      }
      iVar1 = this->set_;
      if (iVar1 == 0) {
        _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->pos_);
        uVar2 = (long)_Var3 / (long)this->settings_->samples_per_row;
        this->start_ = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                            / (long)this->settings_->pattern_length) *
                       this->settings_->samples_per_row * this->settings_->pattern_length;
        this->set_ = 1;
      }
      else if (iVar1 == 1) {
        _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->pos_);
        this->end_ = ((_Var3 / this->settings_->samples_per_row +
                      this->settings_->pattern_length + -1) / this->settings_->pattern_length) *
                     this->settings_->samples_per_row * this->settings_->pattern_length;
        this->set_ = 2;
      }
      else if (iVar1 == 2) {
        this->start_ = 0;
        this->end_ = this->settings_->samples;
        this->set_ = 0;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AudioCtl::key(AKey key, bool pressed) noexcept {
	if (!pressed)
		return false;

	switch (key) {
	case AK_Left:
		timeShift(-settings_.pattern_length);
		break;
	case AK_Right:
		timeShift(settings_.pattern_length);
		break;
	case AK_Up:
		timeShift(4*settings_.pattern_length);
		break;
	case AK_Down:
		timeShift(-4*settings_.pattern_length);
		break;

	case AK_M:
		muted_ = !muted_;
		break;

	case AK_Space:
		paused_ ^= 1;
		break;

	case AK_Z:
		switch (set_) {
		case 0:
			start_ = ((pos_ / settings_.samples_per_row) / settings_.pattern_length) * settings_.samples_per_row * settings_.pattern_length;
			set_ = 1;
			break;
		case 1:
			end_ = (((pos_ / settings_.samples_per_row) + (settings_.pattern_length-1)) / settings_.pattern_length) * settings_.samples_per_row * settings_.pattern_length;
			set_ = 2;
			break;
		case 2:
			start_ = 0;
			end_ = settings_.samples;
			set_ = 0;
		}
		break;
	default:
		return false;
	}

	return true;
}